

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t assignBuf(ion_bpp_handle_t handle,ion_bpp_address_t adr,ion_bpp_buffer_t **b)

{
  ion_bpp_err_t iVar1;
  ion_bpp_buffer_t *piStack_38;
  ion_bpp_err_t rc;
  ion_bpp_buffer_t *buf;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t **b_local;
  ion_bpp_address_t adr_local;
  ion_bpp_handle_t handle_local;
  
  if (adr == 0) {
    *b = (ion_bpp_buffer_t *)((long)handle + 0x20);
  }
  else {
    for (piStack_38 = *(ion_bpp_buffer_t **)((long)handle + 0x48);
        (piStack_38->next != (ion_bpp_buffer_tag *)((long)handle + 0x48) &&
        ((piStack_38->valid == boolean_false || (piStack_38->adr != adr))));
        piStack_38 = piStack_38->next) {
    }
    if (piStack_38->valid == boolean_false) {
      piStack_38->adr = adr;
    }
    else if (piStack_38->adr != adr) {
      if ((piStack_38->modified != boolean_false) &&
         (iVar1 = flush(handle,piStack_38), iVar1 != bErrOk)) {
        return iVar1;
      }
      piStack_38->adr = adr;
      piStack_38->valid = boolean_false;
    }
    piStack_38->next->prev = piStack_38->prev;
    piStack_38->prev->next = piStack_38->next;
    piStack_38->next = *(ion_bpp_buffer_tag **)((long)handle + 0x48);
    piStack_38->prev = (ion_bpp_buffer_tag *)((long)handle + 0x48);
    piStack_38->next->prev = piStack_38;
    piStack_38->prev->next = piStack_38;
    *b = piStack_38;
  }
  return bErrOk;
}

Assistant:

static ion_bpp_err_t
assignBuf(
	ion_bpp_handle_t	handle,
	ion_bpp_address_t	adr,
	ion_bpp_buffer_t	**b
) {
	ion_bpp_h_node_t *h = handle;
	/* assign buf to adr */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	if (adr == 0) {
		*b = &h->root;
		return bErrOk;
	}

	/* search for buf with matching adr */
	buf = h->bufList.next;

	while (buf->next != &h->bufList) {
		if (buf->valid && (buf->adr == adr)) {
			break;
		}

		buf = buf->next;
	}

	/* either buf points to a match, or it's last one in list (LRR) */
	if (buf->valid) {
		if (buf->adr != adr) {
			if (buf->modified) {
				if ((rc = flush(handle, buf)) != 0) {
					return rc;
				}
			}

			buf->adr	= adr;
			buf->valid	= boolean_false;
		}
	}
	else {
		buf->adr = adr;
	}

	/* remove from current position and place at front of list */
	buf->next->prev = buf->prev;
	buf->prev->next = buf->next;
	buf->next		= h->bufList.next;
	buf->prev		= &h->bufList;
	buf->next->prev = buf;
	buf->prev->next = buf;
	*b				= buf;
	return bErrOk;
}